

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O3

Abc_Obj_t * Abc_AigXorLookup(Abc_Aig_t *pMan,Abc_Obj_t *p0,Abc_Obj_t *p1,int *pType)

{
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pAVar2;
  
  if (pType != (int *)0x0) {
    *pType = 0;
  }
  pAVar1 = Abc_AigAndLookup(pMan,(Abc_Obj_t *)((ulong)p0 ^ 1),(Abc_Obj_t *)((ulong)p1 ^ 1));
  if ((pAVar1 == (Abc_Obj_t *)0x0) ||
     (pAVar2 = Abc_AigAndLookup(pMan,p0,p1), pAVar2 == (Abc_Obj_t *)0x0)) {
    pAVar1 = Abc_AigAndLookup(pMan,p0,(Abc_Obj_t *)((ulong)p1 ^ 1));
    if (((pAVar1 != (Abc_Obj_t *)0x0) &&
        (pAVar2 = Abc_AigAndLookup(pMan,(Abc_Obj_t *)((ulong)p0 ^ 1),p1), pAVar2 != (Abc_Obj_t *)0x0
        )) && (pAVar1 = Abc_AigAndLookup(pMan,(Abc_Obj_t *)((ulong)pAVar1 ^ 1),
                                         (Abc_Obj_t *)((ulong)pAVar2 ^ 1)),
              pAVar1 != (Abc_Obj_t *)0x0)) {
      return (Abc_Obj_t *)((ulong)pAVar1 ^ 1);
    }
    return (Abc_Obj_t *)0x0;
  }
  pAVar1 = Abc_AigAndLookup(pMan,(Abc_Obj_t *)((ulong)pAVar1 ^ 1),(Abc_Obj_t *)((ulong)pAVar2 ^ 1));
  if (pType == (int *)0x0) {
    return pAVar1;
  }
  if (pAVar1 == (Abc_Obj_t *)0x0) {
    return (Abc_Obj_t *)0x0;
  }
  *pType = 1;
  return pAVar1;
}

Assistant:

Abc_Obj_t * Abc_AigXorLookup( Abc_Aig_t * pMan, Abc_Obj_t * p0, Abc_Obj_t * p1, int * pType )
{
    Abc_Obj_t * pNode1, * pNode2, * pNode;
    // set the flag to zero
    if ( pType ) *pType = 0;
    // check the case of XOR(a,b) = OR(ab, a'b')'
    if ( (pNode1 = Abc_AigAndLookup(pMan, Abc_ObjNot(p0), Abc_ObjNot(p1))) &&
         (pNode2 = Abc_AigAndLookup(pMan, p0, p1)) ) 
    {
        pNode = Abc_AigAndLookup( pMan, Abc_ObjNot(pNode1), Abc_ObjNot(pNode2) );
        if ( pNode && pType ) *pType = 1;
        return pNode;
    }
    // check the case of XOR(a,b) = OR(a'b, ab')
    if ( (pNode1 = Abc_AigAndLookup(pMan, p0, Abc_ObjNot(p1))) &&
         (pNode2 = Abc_AigAndLookup(pMan, Abc_ObjNot(p0), p1)) ) 
    {
        pNode = Abc_AigAndLookup( pMan, Abc_ObjNot(pNode1), Abc_ObjNot(pNode2) );
        return pNode? Abc_ObjNot(pNode) : NULL;
    }
    return NULL;
}